

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O3

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeIf
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,LogicalExpr condition,
          NumericExpr then_expr,NumericExpr else_expr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"if expression","");
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (NumericExpr)NULL_ID;
}

Assistant:

NumericExpr MakeIf(LogicalExpr condition,
      NumericExpr then_expr, NumericExpr else_expr) {
    internal::Unused(&condition, &then_expr, &else_expr);
    MP_DISPATCH(ReportUnhandledConstruct("if expression"));
    return NumericExpr();
  }